

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Transpose<4,_3>::doApply
          (IRet *__return_storage_ptr__,Transpose<4,_3> *this,EvalContext *param_1,IArgs *iargs)

{
  bool *pbVar1;
  bool *pbVar2;
  double dVar3;
  Vector<tcu::Interval,_3> *pVVar4;
  long lVar5;
  Interval *pIVar6;
  long lVar7;
  
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix(__return_storage_ptr__);
  pVVar4 = (Vector<tcu::Interval,_3> *)iargs->a;
  lVar5 = 0;
  pIVar6 = (Interval *)__return_storage_ptr__;
  do {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)&pIVar6->m_hi + lVar7 * 4) =
           *(undefined8 *)
            ((long)&((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)pVVar4->m_data)->m_data[0].m_data
                    [0].m_hi + lVar7);
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)pVVar4->m_data)->m_data[0].m_data[0].
                m_hasNaN + lVar7;
      dVar3 = *(double *)(pbVar1 + 8);
      pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&pIVar6->m_hasNaN)->m_data[0].m_data[0]
                .m_hasNaN + lVar7 * 4;
      *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
      *(double *)(pbVar2 + 8) = dVar3;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
    lVar5 = lVar5 + 1;
    pVVar4 = pVVar4 + 1;
    pIVar6 = pIVar6 + 1;
  } while (lVar5 != 4);
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&, const IArgs& iargs) const
	{
		IRet ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
		{
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = iargs.a(colNdx, rowNdx);
		}

		return ret;
	}